

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O0

int __thiscall ncnn::Convolution_x86::create_pipeline(Convolution_x86 *this,Option *opt)

{
  long *plVar1;
  int *piVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  Layer *pLVar6;
  void **ppvVar7;
  undefined8 *puVar8;
  reference pvVar9;
  byte *in_RSI;
  long in_RDI;
  bool prefer_sgemm;
  int l2_cache_size;
  bool prefer_winograd43;
  bool prefer_winograd23;
  bool prefer_winograd63;
  int h;
  int w;
  bool prefer_winograd;
  int out_elempack;
  int elempack;
  Mat weights_1 [1];
  Mat weights [2];
  ParamDict pd;
  int num_input;
  int kernel_size;
  undefined4 in_stack_fffffffffffffb80;
  int in_stack_fffffffffffffb84;
  undefined8 in_stack_fffffffffffffb88;
  int num_input_00;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_fffffffffffffb90;
  undefined6 in_stack_fffffffffffffb98;
  undefined1 in_stack_fffffffffffffb9e;
  undefined1 in_stack_fffffffffffffb9f;
  ParamDict *in_stack_fffffffffffffba0;
  byte local_453;
  Option *in_stack_fffffffffffffbb0;
  int in_stack_fffffffffffffbb8;
  int in_stack_fffffffffffffbbc;
  int in_stack_fffffffffffffbc0;
  undefined8 *local_410;
  undefined8 *local_3d8;
  Option *in_stack_fffffffffffffc30;
  Mat *in_stack_fffffffffffffc38;
  int in_stack_fffffffffffffc44;
  void **local_398;
  void **local_350;
  byte local_32f;
  bool local_32e;
  bool local_32d;
  int local_320;
  int local_31c;
  undefined1 local_318 [8];
  int in_stack_fffffffffffffcf0;
  int in_stack_fffffffffffffcf4;
  undefined4 in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffcfc;
  void *__ptr;
  Mat *in_stack_fffffffffffffd00;
  Mat *in_stack_fffffffffffffd08;
  long *local_2e8;
  undefined8 uStack_2c0;
  undefined1 local_2b8 [16];
  void *local_2a8;
  int *local_2a0;
  undefined8 local_298;
  undefined4 local_290;
  Option *in_stack_fffffffffffffd78;
  int in_stack_fffffffffffffd80;
  int in_stack_fffffffffffffd84;
  Mat *in_stack_fffffffffffffd88;
  int in_stack_fffffffffffffd90;
  int in_stack_fffffffffffffd94;
  Mat *in_stack_fffffffffffffd98;
  Mat *in_stack_fffffffffffffda0;
  int *local_258;
  long *local_240;
  void *apvStack_218 [2];
  ParamDict local_208;
  int local_1f8;
  int local_1f4;
  byte *local_1f0;
  int local_1dc;
  void **local_1d8;
  undefined8 *local_1d0;
  void **local_1c0;
  int in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe54;
  undefined8 in_stack_fffffffffffffe58;
  Mat *in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  undefined8 in_stack_fffffffffffffe70;
  Mat *in_stack_fffffffffffffe78;
  Mat *in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed8;
  
  __ptr = (void *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8);
  if (*(int *)(in_RDI + 0x158) == 0) {
    local_1f0 = in_RSI;
    pLVar6 = create_activation_layer
                       (in_stack_fffffffffffffc44,in_stack_fffffffffffffc38,
                        in_stack_fffffffffffffc30);
    *(Layer **)(in_RDI + 0x2c8) = pLVar6;
    *(undefined4 *)(in_RDI + 0x2d0) = *(undefined4 *)(local_1f0 + 4);
    if (((local_1f0[0x1e] & 1) == 0) || (*(long *)(in_RDI + 0x170) != 1)) {
      local_1f4 = *(int *)(in_RDI + 0xd4) * *(int *)(in_RDI + 0xd8);
      uVar3 = (long)*(int *)(in_RDI + 0x104) / (long)local_1f4;
      local_1f8 = (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) /
                       (long)*(int *)(in_RDI + 0xd0));
      if ((((local_1f0[0x27] & 1) == 0) &&
          (((*(int *)(in_RDI + 0xd4) == *(int *)(in_RDI + 0xd8) && (*(int *)(in_RDI + 0xdc) != 1))
           && (*(int *)(in_RDI + 0xe0) == *(int *)(in_RDI + 0xdc))))) &&
         ((*(int *)(in_RDI + 0xe4) == 1 && (*(int *)(in_RDI + 0xe8) == 1)))) {
        pLVar6 = create_layer_cpu((int)((ulong)in_stack_fffffffffffffb88 >> 0x20));
        *(Layer **)(in_RDI + 0x440) = pLVar6;
        ParamDict::ParamDict(in_stack_fffffffffffffba0);
        ParamDict::set(&local_208,0,*(int *)(in_RDI + 0xd0));
        ParamDict::set(&local_208,1,*(int *)(in_RDI + 0xd4));
        ParamDict::set(&local_208,0xb,*(int *)(in_RDI + 0xd8));
        ParamDict::set(&local_208,2,1);
        ParamDict::set(&local_208,0xc,1);
        ParamDict::set(&local_208,3,1);
        ParamDict::set(&local_208,0xd,1);
        ParamDict::set(&local_208,4,0);
        ParamDict::set(&local_208,0xe,0);
        ParamDict::set(&local_208,5,*(int *)(in_RDI + 0x100));
        ParamDict::set(&local_208,6,*(int *)(in_RDI + 0x104));
        (**(code **)(**(long **)(in_RDI + 0x440) + 0x10))(*(long **)(in_RDI + 0x440),&local_208);
        if (*(int *)(in_RDI + 0x100) == 0) {
          local_3d8 = (undefined8 *)&stack0xfffffffffffffcf8;
          do {
            local_1d0 = local_3d8;
            *local_3d8 = 0;
            local_3d8[1] = 0;
            local_3d8[2] = 0;
            *(undefined4 *)(local_3d8 + 3) = 0;
            local_3d8[4] = 0;
            *(undefined4 *)(local_3d8 + 5) = 0;
            *(undefined4 *)((long)local_3d8 + 0x2c) = 0;
            *(undefined4 *)(local_3d8 + 6) = 0;
            *(undefined4 *)((long)local_3d8 + 0x34) = 0;
            *(undefined4 *)(local_3d8 + 7) = 0;
            local_3d8[8] = 0;
            local_3d8 = local_3d8 + 9;
          } while (local_3d8 != &uStack_2c0);
          if (&stack0xfffffffffffffcf8 != (undefined1 *)(in_RDI + 0x160)) {
            if (*(long *)(in_RDI + 0x168) != 0) {
              LOCK();
              **(int **)(in_RDI + 0x168) = **(int **)(in_RDI + 0x168) + 1;
              UNLOCK();
            }
            if (in_stack_fffffffffffffd00 != (Mat *)0x0) {
              LOCK();
              iVar5 = *(int *)&in_stack_fffffffffffffd00->data;
              *(int *)&in_stack_fffffffffffffd00->data =
                   *(int *)&in_stack_fffffffffffffd00->data + -1;
              UNLOCK();
              if (iVar5 == 1) {
                if (local_2e8 == (long *)0x0) {
                  if (__ptr != (void *)0x0) {
                    free(__ptr);
                  }
                }
                else {
                  (**(code **)(*local_2e8 + 0x18))(local_2e8,__ptr);
                }
              }
            }
          }
          plVar1 = *(long **)(in_RDI + 0x440);
          ModelBinFromMatArray::ModelBinFromMatArray
                    ((ModelBinFromMatArray *)in_stack_fffffffffffffba0,
                     (Mat *)CONCAT17(in_stack_fffffffffffffb9f,
                                     CONCAT16(in_stack_fffffffffffffb9e,in_stack_fffffffffffffb98)))
          ;
          (**(code **)(*plVar1 + 0x18))(plVar1,local_318);
          ModelBinFromMatArray::~ModelBinFromMatArray
                    ((ModelBinFromMatArray *)
                     CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
          local_410 = &uStack_2c0;
          do {
            puVar8 = local_410 + -9;
            if (local_410[-8] != 0) {
              piVar2 = (int *)local_410[-8];
              LOCK();
              iVar5 = *piVar2;
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (iVar5 == 1) {
                if (local_410[-5] == 0) {
                  if ((void *)*puVar8 != (void *)0x0) {
                    free((void *)*puVar8);
                  }
                }
                else {
                  (**(code **)(*(long *)local_410[-5] + 0x18))((long *)local_410[-5],*puVar8);
                }
              }
            }
            *puVar8 = 0;
            local_410[-7] = 0;
            *(undefined4 *)(local_410 + -6) = 0;
            *(undefined4 *)(local_410 + -4) = 0;
            *(undefined4 *)((long)local_410 + -0x1c) = 0;
            *(undefined4 *)(local_410 + -3) = 0;
            *(undefined4 *)((long)local_410 + -0x14) = 0;
            *(undefined4 *)(local_410 + -2) = 0;
            local_410[-1] = 0;
            local_410[-8] = 0;
            local_410 = puVar8;
          } while (puVar8 != (undefined8 *)&stack0xfffffffffffffcf8);
        }
        else {
          local_350 = &local_2a8;
          do {
            local_1d8 = local_350;
            *local_350 = (void *)0x0;
            local_350[1] = (void *)0x0;
            local_350[2] = (void *)0x0;
            *(undefined4 *)(local_350 + 3) = 0;
            local_350[4] = (void *)0x0;
            *(undefined4 *)(local_350 + 5) = 0;
            *(undefined4 *)((long)local_350 + 0x2c) = 0;
            *(undefined4 *)(local_350 + 6) = 0;
            *(undefined4 *)((long)local_350 + 0x34) = 0;
            *(undefined4 *)(local_350 + 7) = 0;
            local_350[8] = (void *)0x0;
            local_350 = local_350 + 9;
          } while (local_350 != apvStack_218);
          if (&local_2a8 != (void **)(in_RDI + 0x160)) {
            if (*(long *)(in_RDI + 0x168) != 0) {
              LOCK();
              **(int **)(in_RDI + 0x168) = **(int **)(in_RDI + 0x168) + 1;
              UNLOCK();
            }
            if (local_2a0 != (int *)0x0) {
              LOCK();
              iVar5 = *local_2a0;
              *local_2a0 = *local_2a0 + -1;
              UNLOCK();
              if (iVar5 == 1) {
                if (in_stack_fffffffffffffd78 == (Option *)0x0) {
                  if (local_2a8 != (void *)0x0) {
                    free(local_2a8);
                  }
                }
                else {
                  (**(code **)(*(long *)in_stack_fffffffffffffd78 + 0x18))
                            (in_stack_fffffffffffffd78,local_2a8);
                }
              }
            }
            local_2a8 = *(void **)(in_RDI + 0x160);
            local_2a0 = *(int **)(in_RDI + 0x168);
            local_298 = *(undefined8 *)(in_RDI + 0x170);
            local_290 = *(undefined4 *)(in_RDI + 0x178);
          }
          if (&stack0xfffffffffffffda0 != (undefined1 *)(in_RDI + 0x1a8)) {
            if (*(long *)(in_RDI + 0x1b0) != 0) {
              LOCK();
              **(int **)(in_RDI + 0x1b0) = **(int **)(in_RDI + 0x1b0) + 1;
              UNLOCK();
            }
            if (local_258 != (int *)0x0) {
              LOCK();
              iVar5 = *local_258;
              *local_258 = *local_258 + -1;
              UNLOCK();
              if (iVar5 == 1) {
                if (local_240 == (long *)0x0) {
                  if (in_stack_fffffffffffffda0 != (Mat *)0x0) {
                    free(in_stack_fffffffffffffda0);
                  }
                }
                else {
                  (**(code **)(*local_240 + 0x18))(local_240,in_stack_fffffffffffffda0);
                }
              }
            }
          }
          plVar1 = *(long **)(in_RDI + 0x440);
          ModelBinFromMatArray::ModelBinFromMatArray
                    ((ModelBinFromMatArray *)in_stack_fffffffffffffba0,
                     (Mat *)CONCAT17(in_stack_fffffffffffffb9f,
                                     CONCAT16(in_stack_fffffffffffffb9e,in_stack_fffffffffffffb98)))
          ;
          (**(code **)(*plVar1 + 0x18))(plVar1,local_2b8);
          ModelBinFromMatArray::~ModelBinFromMatArray
                    ((ModelBinFromMatArray *)
                     CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
          local_398 = apvStack_218;
          do {
            ppvVar7 = local_398 + -9;
            local_1c0 = ppvVar7;
            if (local_398[-8] != (void *)0x0) {
              piVar2 = (int *)local_398[-8];
              LOCK();
              iVar5 = *piVar2;
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (iVar5 == 1) {
                if (local_398[-5] == (void *)0x0) {
                  if (*ppvVar7 != (void *)0x0) {
                    free(*ppvVar7);
                  }
                }
                else {
                  (**(code **)(*local_398[-5] + 0x18))(local_398[-5],*ppvVar7);
                }
              }
            }
            *ppvVar7 = (void *)0x0;
            local_398[-7] = (void *)0x0;
            *(undefined4 *)(local_398 + -6) = 0;
            *(undefined4 *)(local_398 + -4) = 0;
            *(undefined4 *)((long)local_398 + -0x1c) = 0;
            *(undefined4 *)(local_398 + -3) = 0;
            *(undefined4 *)((long)local_398 + -0x14) = 0;
            *(undefined4 *)(local_398 + -2) = 0;
            local_398[-1] = (void *)0x0;
            local_398[-8] = (void *)0x0;
            local_398 = ppvVar7;
          } while (ppvVar7 != &local_2a8);
        }
        (**(code **)(**(long **)(in_RDI + 0x440) + 0x20))(*(long **)(in_RDI + 0x440),local_1f0);
        if ((*local_1f0 & 1) != 0) {
          puVar8 = (undefined8 *)(in_RDI + 0x160);
          if (*(long *)(in_RDI + 0x168) != 0) {
            piVar2 = *(int **)(in_RDI + 0x168);
            LOCK();
            iVar5 = *piVar2;
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (iVar5 == 1) {
              if (*(long *)(in_RDI + 0x180) == 0) {
                if ((void *)*puVar8 != (void *)0x0) {
                  free((void *)*puVar8);
                }
              }
              else {
                (**(code **)(**(long **)(in_RDI + 0x180) + 0x18))
                          (*(long **)(in_RDI + 0x180),*puVar8);
              }
            }
          }
          *puVar8 = 0;
          puVar8[2] = 0;
          *(undefined4 *)(puVar8 + 3) = 0;
          *(undefined4 *)(puVar8 + 5) = 0;
          *(undefined4 *)((long)puVar8 + 0x2c) = 0;
          *(undefined4 *)(puVar8 + 6) = 0;
          *(undefined4 *)((long)puVar8 + 0x34) = 0;
          *(undefined4 *)(puVar8 + 7) = 0;
          puVar8[8] = 0;
          puVar8[1] = 0;
        }
        local_1dc = 0;
        ParamDict::~ParamDict
                  ((ParamDict *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
      }
      else {
        local_31c = 1;
        local_320 = 1;
        if ((local_1f0[0x27] & 1) != 0) {
          local_31c = 1;
          if (local_1f8 % 4 == 0) {
            local_31c = 4;
          }
          local_320 = 1;
          if (*(int *)(in_RDI + 0xd0) % 4 == 0) {
            local_320 = 4;
          }
        }
        if (((((local_1f0[0x37] & 1) != 0) || ((local_1f0[0x38] & 1) != 0)) ||
            (bVar4 = false, (local_1f0[0x39] & 1) != 0)) && (bVar4 = true, local_1f8 < 9)) {
          bVar4 = 8 < *(int *)(in_RDI + 0xd0);
        }
        if ((((((local_1f0[0x1c] & 1) == 0) || (!bVar4)) || (*(int *)(in_RDI + 0xd4) != 3)) ||
            ((*(int *)(in_RDI + 0xd8) != 3 || (*(int *)(in_RDI + 0xdc) != 1)))) ||
           ((*(int *)(in_RDI + 0xe0) != 1 ||
            ((*(int *)(in_RDI + 0xe4) != 1 || (*(int *)(in_RDI + 0xe8) != 1)))))) {
          iVar5 = get_cpu_level2_cache_size();
          bVar4 = true;
          if ((local_1f8 * *(int *)(in_RDI + 0xd0) * *(int *)(in_RDI + 0xd4) *
               *(int *)(in_RDI + 0xd8) * *(int *)(in_RDI + 0xdc) * *(int *)(in_RDI + 0xe0) *
               *(int *)(in_RDI + 0xe4) * *(int *)(in_RDI + 0xe8) * 8 <= iVar5) &&
             (bVar4 = true, local_1f8 < 0x11)) {
            bVar4 = 0x10 < *(int *)(in_RDI + 0xd0);
          }
          if ((((local_1f0[0x1d] & 1) != 0) && (bVar4)) ||
             ((*(int *)(in_RDI + 0xd4) == 1 && (*(int *)(in_RDI + 0xd8) == 1)))) {
            convolution_im2col_gemm_transform_kernel
                      ((Mat *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                       in_stack_fffffffffffffe60,(int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                       (int)in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
                       in_stack_fffffffffffffe50,(Option *)weights_1[0].data);
            if ((*local_1f0 & 1) != 0) {
              puVar8 = (undefined8 *)(in_RDI + 0x160);
              if (*(long *)(in_RDI + 0x168) != 0) {
                piVar2 = *(int **)(in_RDI + 0x168);
                LOCK();
                iVar5 = *piVar2;
                *piVar2 = *piVar2 + -1;
                UNLOCK();
                if (iVar5 == 1) {
                  if (*(long *)(in_RDI + 0x180) == 0) {
                    if ((void *)*puVar8 != (void *)0x0) {
                      free((void *)*puVar8);
                    }
                  }
                  else {
                    (**(code **)(**(long **)(in_RDI + 0x180) + 0x18))
                              (*(long **)(in_RDI + 0x180),*puVar8);
                  }
                }
              }
              *puVar8 = 0;
              puVar8[2] = 0;
              *(undefined4 *)(puVar8 + 3) = 0;
              *(undefined4 *)(puVar8 + 5) = 0;
              *(undefined4 *)((long)puVar8 + 0x2c) = 0;
              *(undefined4 *)(puVar8 + 6) = 0;
              *(undefined4 *)((long)puVar8 + 0x34) = 0;
              *(undefined4 *)(puVar8 + 7) = 0;
              puVar8[8] = 0;
              puVar8[1] = 0;
            }
            local_1dc = 0;
          }
          else {
            if (((((((((local_31c == 0x10) && (local_320 == 1)) && (*(int *)(in_RDI + 0xd4) == 3))
                    && ((*(int *)(in_RDI + 0xd8) == 3 && (*(int *)(in_RDI + 0xdc) == 1)))) &&
                   (*(int *)(in_RDI + 0xe0) == 1)) &&
                  ((*(int *)(in_RDI + 0xe4) == 1 && (*(int *)(in_RDI + 0xe8) == 1)))) ||
                 ((((local_31c == 8 &&
                    (((local_320 == 8 && (*(int *)(in_RDI + 0xd4) == 3)) &&
                     (*(int *)(in_RDI + 0xd8) == 3)))) &&
                   (((*(int *)(in_RDI + 0xdc) == 1 && (*(int *)(in_RDI + 0xe0) == 1)) &&
                    (*(int *)(in_RDI + 0xe4) == 1)))) && (*(int *)(in_RDI + 0xe8) == 1)))) ||
                (((local_31c == 8 && (local_320 == 8)) &&
                 (((*(int *)(in_RDI + 0xd4) == 2 &&
                   (((*(int *)(in_RDI + 0xd8) == 2 && (*(int *)(in_RDI + 0xdc) == 1)) &&
                    (*(int *)(in_RDI + 0xe0) == 1)))) &&
                  ((*(int *)(in_RDI + 0xe4) == 1 && (*(int *)(in_RDI + 0xe8) == 1)))))))) ||
               (((local_31c == 1 &&
                 (((local_320 == 8 && (*(int *)(in_RDI + 0xd4) == 3)) &&
                  ((*(int *)(in_RDI + 0xd8) == 3 &&
                   ((((*(int *)(in_RDI + 0xdc) == 1 && (*(int *)(in_RDI + 0xe0) == 1)) &&
                     (*(int *)(in_RDI + 0xe4) == 1)) && (*(int *)(in_RDI + 0xe8) == 1)))))))) ||
                (((((local_31c == 1 && (local_320 == 8)) && (*(int *)(in_RDI + 0xd4) == 3)) &&
                  (((*(int *)(in_RDI + 0xd8) == 3 && (*(int *)(in_RDI + 0xdc) == 1)) &&
                   ((*(int *)(in_RDI + 0xe0) == 1 &&
                    ((*(int *)(in_RDI + 0xe4) == 2 && (*(int *)(in_RDI + 0xe8) == 2)))))))) ||
                 (((((local_31c == 8 &&
                     (((local_320 == 1 && (*(int *)(in_RDI + 0xd4) == 3)) &&
                      (*(int *)(in_RDI + 0xd8) == 3)))) &&
                    ((*(int *)(in_RDI + 0xdc) == 1 && (*(int *)(in_RDI + 0xe0) == 1)))) &&
                   ((*(int *)(in_RDI + 0xe4) == 1 && (*(int *)(in_RDI + 0xe8) == 1)))) ||
                  ((((((local_31c == 1 && (local_320 == 4)) && (*(int *)(in_RDI + 0xd4) == 3)) &&
                     (((*(int *)(in_RDI + 0xd8) == 3 && (*(int *)(in_RDI + 0xdc) == 1)) &&
                      (*(int *)(in_RDI + 0xe0) == 1)))) &&
                    ((*(int *)(in_RDI + 0xe4) == 1 && (*(int *)(in_RDI + 0xe8) == 1)))) ||
                   ((((local_31c == 1 && ((local_320 == 4 && (*(int *)(in_RDI + 0xd4) == 3)))) &&
                     (*(int *)(in_RDI + 0xd8) == 3)) &&
                    ((((*(int *)(in_RDI + 0xdc) == 1 && (*(int *)(in_RDI + 0xe0) == 1)) &&
                      (*(int *)(in_RDI + 0xe4) == 2)) && (*(int *)(in_RDI + 0xe8) == 2))))))))))))))
            {
              convolution_transform_kernel_packed_sse
                        (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                         (int)((ulong)__ptr >> 0x20),(int)__ptr,in_stack_fffffffffffffcf4,
                         in_stack_fffffffffffffcf0,in_stack_fffffffffffffed0,
                         in_stack_fffffffffffffed8);
            }
            else {
              convolution_transform_kernel_packed
                        (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                         (int)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                         (int)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,
                         in_stack_fffffffffffffe68);
            }
            if ((*local_1f0 & 1) != 0) {
              puVar8 = (undefined8 *)(in_RDI + 0x160);
              if (*(long *)(in_RDI + 0x168) != 0) {
                piVar2 = *(int **)(in_RDI + 0x168);
                LOCK();
                iVar5 = *piVar2;
                *piVar2 = *piVar2 + -1;
                UNLOCK();
                if (iVar5 == 1) {
                  if (*(long *)(in_RDI + 0x180) == 0) {
                    if ((void *)*puVar8 != (void *)0x0) {
                      free((void *)*puVar8);
                    }
                  }
                  else {
                    (**(code **)(**(long **)(in_RDI + 0x180) + 0x18))
                              (*(long **)(in_RDI + 0x180),*puVar8);
                  }
                }
              }
              *puVar8 = 0;
              puVar8[2] = 0;
              *(undefined4 *)(puVar8 + 3) = 0;
              *(undefined4 *)(puVar8 + 5) = 0;
              *(undefined4 *)((long)puVar8 + 0x2c) = 0;
              *(undefined4 *)(puVar8 + 6) = 0;
              *(undefined4 *)((long)puVar8 + 0x34) = 0;
              *(undefined4 *)(puVar8 + 7) = 0;
              puVar8[8] = 0;
              puVar8[1] = 0;
            }
            local_1dc = 0;
          }
        }
        else {
          bVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::empty
                            (in_stack_fffffffffffffb90);
          iVar5 = (int)((ulong)in_stack_fffffffffffffbb0 >> 0x20);
          if ((((bVar4) ||
               (pvVar9 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                   ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(in_RDI + 0xa0)
                                    ,0), pvVar9->w == 0)) ||
              (pvVar9 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                  ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(in_RDI + 0xa0),
                                   0), pvVar9->h == 0)) &&
             (((bVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::empty
                                  (in_stack_fffffffffffffb90), bVar4 ||
               (pvVar9 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                   ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(in_RDI + 0xb8)
                                    ,0), pvVar9->w == 0)) ||
              (pvVar9 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                  ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(in_RDI + 0xb8),
                                   0), pvVar9->h == 0)))) {
            if ((((local_1f0[0x39] & 1) == 0) || (0x20 < local_1f8)) ||
               (0x20 < *(int *)(in_RDI + 0xd0))) {
              if ((local_1f0[0x38] & 1) == 0) {
                conv3x3s1_winograd23_transform_kernel
                          ((Mat *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                           in_stack_fffffffffffffd88,in_stack_fffffffffffffd84,
                           in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
              }
              else {
                conv3x3s1_winograd43_transform_kernel
                          ((Mat *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                           in_stack_fffffffffffffd88,in_stack_fffffffffffffd84,
                           in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
              }
            }
            else {
              conv3x3s1_winograd63_transform_kernel
                        (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                         in_stack_fffffffffffffd94,in_stack_fffffffffffffd90,
                         (Option *)in_stack_fffffffffffffd88);
            }
          }
          else {
            bVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::empty
                              (in_stack_fffffffffffffb90);
            num_input_00 = (int)in_stack_fffffffffffffb90;
            if (((bVar4) ||
                (pvVar9 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                    ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                                     (in_RDI + 0xb8),0), pvVar9->w == 0)) ||
               (pvVar9 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                   ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(in_RDI + 0xb8)
                                    ,0), pvVar9->h == 0)) {
              std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                        ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(in_RDI + 0xa0),0);
              std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                        ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(in_RDI + 0xa0),0);
            }
            else {
              std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                        ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(in_RDI + 0xb8),0);
              std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                        ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(in_RDI + 0xb8),0);
            }
            local_32d = test_prefer_winograd63
                                  (num_input_00,(int)((ulong)in_stack_fffffffffffffb88 >> 0x20),
                                   (int)in_stack_fffffffffffffb88,in_stack_fffffffffffffb84);
            local_32e = test_prefer_winograd23
                                  (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
                                   in_stack_fffffffffffffbb8,iVar5);
            local_453 = 0;
            if (!local_32d) {
              local_453 = local_32e ^ 0xff;
            }
            local_32f = local_453 & 1;
            if ((local_32e) && ((local_1f0[0x37] & 1) == 0)) {
              local_32e = false;
              local_32f = 1;
            }
            if ((local_32d) && ((local_1f0[0x39] & 1) == 0)) {
              local_32d = false;
              local_32f = 1;
            }
            if ((local_32f != 0) && ((local_1f0[0x38] & 1) == 0)) {
              local_32f = 0;
              if ((local_1f0[0x39] & 1) == 0) {
                local_32e = true;
              }
              else {
                local_32d = true;
              }
            }
            if (local_32e == false) {
              if (local_32f == 0) {
                if (local_32d != false) {
                  conv3x3s1_winograd63_transform_kernel
                            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                             in_stack_fffffffffffffd94,in_stack_fffffffffffffd90,
                             (Option *)in_stack_fffffffffffffd88);
                }
              }
              else {
                conv3x3s1_winograd43_transform_kernel
                          ((Mat *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                           in_stack_fffffffffffffd88,in_stack_fffffffffffffd84,
                           in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
              }
            }
            else {
              conv3x3s1_winograd23_transform_kernel
                        ((Mat *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                         in_stack_fffffffffffffd88,in_stack_fffffffffffffd84,
                         in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
            }
          }
          if ((*local_1f0 & 1) != 0) {
            puVar8 = (undefined8 *)(in_RDI + 0x160);
            if (*(long *)(in_RDI + 0x168) != 0) {
              piVar2 = *(int **)(in_RDI + 0x168);
              LOCK();
              iVar5 = *piVar2;
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (iVar5 == 1) {
                if (*(long *)(in_RDI + 0x180) == 0) {
                  if ((void *)*puVar8 != (void *)0x0) {
                    free((void *)*puVar8);
                  }
                }
                else {
                  (**(code **)(**(long **)(in_RDI + 0x180) + 0x18))
                            (*(long **)(in_RDI + 0x180),*puVar8);
                }
              }
            }
            *puVar8 = 0;
            puVar8[2] = 0;
            *(undefined4 *)(puVar8 + 3) = 0;
            *(undefined4 *)(puVar8 + 5) = 0;
            *(undefined4 *)((long)puVar8 + 0x2c) = 0;
            *(undefined4 *)(puVar8 + 6) = 0;
            *(undefined4 *)((long)puVar8 + 0x34) = 0;
            *(undefined4 *)(puVar8 + 7) = 0;
            puVar8[8] = 0;
            puVar8[1] = 0;
          }
          local_1dc = 0;
        }
      }
    }
    else {
      local_1dc = create_pipeline_int8_x86
                            ((Convolution_x86 *)
                             CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                             in_stack_fffffffffffffbb0);
    }
  }
  else {
    local_1dc = 0;
  }
  return local_1dc;
}

Assistant:

int Convolution_x86::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);
    nT = opt.num_threads;

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    if (!opt.use_packing_layout && kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        convolution_dilation1 = ncnn::create_layer_cpu(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, 1);
        pd.set(12, 1);
        pd.set(3, 1);  // stride_w
        pd.set(13, 1); // stride_h
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, weight_data_size);

        convolution_dilation1->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = weight_data;
            weights[1] = bias_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = weight_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }

        convolution_dilation1->create_pipeline(opt);

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && (num_input > 8 || num_output > 8);

    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        if ((bottom_shapes.empty() || bottom_shapes[0].w == 0 || bottom_shapes[0].h == 0) && (top_shapes.empty() || top_shapes[0].w == 0 || top_shapes[0].h == 0))
        {
            // dynamic shape
            if ((opt.use_winograd63_convolution) && (num_input <= 32 && num_output <= 32))
                conv3x3s1_winograd63_transform_kernel(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if (opt.use_winograd43_convolution)
                conv3x3s1_winograd43_transform_kernel(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else
                conv3x3s1_winograd23_transform_kernel(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else
        {
            int w;
            int h;
            if (top_shapes.empty() || top_shapes[0].w == 0 || top_shapes[0].h == 0)
            {
                w = bottom_shapes[0].w;
                h = bottom_shapes[0].h;

                // make padding
                if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
                {
                    w += pad_left + pad_right;
                    h += pad_top + pad_bottom;
                }
                else if ((pad_left == -233 && pad_right == -233 && pad_top == -233 && pad_bottom == -233)
                         || (pad_left == -234 && pad_right == -234 && pad_top == -234 && pad_bottom == -234))
                {
                    // tensorflow padding=SAME or onnx padding=SAME_UPPER/SAME_LOWER
                    w += 2;
                    h += 2;
                }
            }
            else
            {
                w = top_shapes[0].w + 2;
                h = top_shapes[0].h + 2;
            }

            bool prefer_winograd63 = test_prefer_winograd63(num_input, num_output, w, h);
            bool prefer_winograd23 = test_prefer_winograd23(num_input, num_output, w, h);
            bool prefer_winograd43 = !prefer_winograd63 && !prefer_winograd23;

            if (prefer_winograd23 && !opt.use_winograd23_convolution)
            {
                // f23 fallback to f43
                prefer_winograd23 = false;
                prefer_winograd43 = true;
            }

            if (prefer_winograd63 && !opt.use_winograd63_convolution)
            {
                // f63 fallback to f43
                prefer_winograd63 = false;
                prefer_winograd43 = true;
            }

            if (prefer_winograd43 && !opt.use_winograd43_convolution)
            {
                // f43 fallback to f63 or f23
                prefer_winograd43 = false;
                if (opt.use_winograd63_convolution)
                {
                    prefer_winograd63 = true;
                }
                else
                {
                    prefer_winograd23 = true;
                }
            }

            if (prefer_winograd23)
            {
                conv3x3s1_winograd23_transform_kernel(weight_data, weight_winograd23_data, num_input, num_output, opt);
            }
            else if (prefer_winograd43)
            {
                conv3x3s1_winograd43_transform_kernel(weight_data, weight_winograd43_data, num_input, num_output, opt);
            }
            else if (prefer_winograd63)
            {
                conv3x3s1_winograd63_transform_kernel(weight_data, weight_winograd63_data, num_input, num_output, opt);
            }
            else
            {
                // should never reach here
            }
        }

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    int l2_cache_size = get_cpu_level2_cache_size();
    bool prefer_sgemm = num_input * num_output * kernel_w * kernel_h * dilation_w * dilation_h * stride_w * stride_h * (int)sizeof(float) * 2 > l2_cache_size || (num_input > 16 || num_output > 16);

    if ((opt.use_sgemm_convolution && prefer_sgemm) || (kernel_w == 1 && kernel_h == 1))
    {
        convolution_im2col_gemm_transform_kernel(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h, opt);

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    if ((elempack == 16 && out_elempack == 1 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 8 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 8 && out_elempack == 8 && kernel_w == 2 && kernel_h == 2 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 1 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 1 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            || (elempack == 8 && out_elempack == 1 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 1 && out_elempack == 4 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 1 && out_elempack == 4 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2))
    {
        convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
    }
    else
    {
        convolution_transform_kernel_packed(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h);
    }

    if (opt.lightmode)
        weight_data.release();

    return 0;
}